

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginOperator.cpp
# Opt level: O0

void __thiscall
adios2::plugin::PluginOperator::PluginOperator(PluginOperator *this,Params *parameters)

{
  bool bVar1;
  iterator pluginLibrary;
  pointer ppVar2;
  pointer __k;
  mapped_type *pmVar3;
  undefined8 *in_RDI;
  iterator pluginLibIt;
  iterator pluginNameIt;
  pointer in_stack_fffffffffffffde8;
  Impl *in_stack_fffffffffffffdf0;
  Params *in_stack_fffffffffffffe10;
  allocator *paVar4;
  string *in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  OperatorType typeEnum;
  string *psVar5;
  string *in_stack_fffffffffffffe28;
  Operator *in_stack_fffffffffffffe30;
  allocator *this_00;
  bool local_1c1;
  string *pluginName;
  PluginOperator *this_01;
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  int *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  Params *in_stack_fffffffffffffee8;
  _Self local_108;
  _Self local_100;
  undefined1 local_f1 [33];
  _Self local_d0;
  allocator local_c1;
  string local_c0 [32];
  _Self local_a0;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  typeEnum = (OperatorType)((ulong)in_stack_fffffffffffffe20 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"plugin",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"plugin",&local_69);
  core::Operator::Operator
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,typeEnum,in_stack_fffffffffffffe18,
             in_stack_fffffffffffffe10);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  *in_RDI = &PTR__PluginOperator_01133648;
  operator_new(0x80);
  Impl::Impl(in_stack_fffffffffffffdf0);
  std::
  unique_ptr<adios2::plugin::PluginOperator::Impl,std::default_delete<adios2::plugin::PluginOperator::Impl>>
  ::unique_ptr<std::default_delete<adios2::plugin::PluginOperator::Impl>,void>
            ((unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
              *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"verbose",&local_91);
  std::
  unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
  ::operator->((unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
                *)0xacd4d2);
  helper::GetParameter<int>
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"pluginname",&local_c1);
  local_a0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&in_stack_fffffffffffffde8->m_PluginParams,(key_type *)0xacd560);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  pluginName = (string *)(in_RDI + 10);
  this_01 = (PluginOperator *)local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_f1 + 1),"pluginlibrary",(allocator *)this_01);
  pluginLibrary =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&in_stack_fffffffffffffde8->m_PluginParams,(key_type *)0xacd5de);
  local_d0._M_node = pluginLibrary._M_node;
  std::__cxx11::string::~string((string *)(local_f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f1);
  local_100._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&in_stack_fffffffffffffde8->m_PluginParams);
  bVar1 = std::operator!=(&local_a0,&local_100);
  local_1c1 = false;
  if (bVar1) {
    local_108._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&in_stack_fffffffffffffde8->m_PluginParams);
    local_1c1 = std::operator!=(&local_d0,&local_108);
  }
  if (local_1c1 != false) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0xacd695);
    psVar5 = (string *)&ppVar2->second;
    __k = std::
          unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
          ::operator->((unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
                        *)0xacd6b2);
    this_00 = &local_129;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffed8,"PluginName",this_00);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this_00,(key_type *)__k);
    std::__cxx11::string::operator=((string *)pmVar3,psVar5);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0xacd735);
    std::
    unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
    ::operator->((unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
                  *)0xacd752);
    paVar4 = &local_151;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,"PluginLibrary",paVar4);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this_00,(key_type *)__k);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&ppVar2->second);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0xacd7d5);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0xacd7eb);
    PluginInit(this_01,pluginName,(string *)pluginLibrary._M_node);
  }
  return;
}

Assistant:

PluginOperator::PluginOperator(const Params &parameters)
: Operator("plugin", PLUGIN_INTERFACE, "plugin", parameters), m_Impl(new Impl)
{
    helper::GetParameter(m_Parameters, "verbose", m_Impl->m_Verbosity);

    // It is possible for 'pluginname' and 'pluginlibrary' to not be in
    // m_Parameters (e.g., when using bpls, which will call InverseOperate).
    // PluginName and PluginLibrary which will be saved in header info in the
    // Operate() call, so that in this situation, the plugin can be loaded
    // to perform InverseOperate.
    auto pluginNameIt = m_Parameters.find("pluginname");
    auto pluginLibIt = m_Parameters.find("pluginlibrary");
    if (pluginNameIt != m_Parameters.end() && pluginLibIt != m_Parameters.end())
    {
        m_Impl->m_PluginParams["PluginName"] = pluginNameIt->second;
        m_Impl->m_PluginParams["PluginLibrary"] = pluginLibIt->second;
        PluginInit(pluginNameIt->second, pluginLibIt->second);
    }
}